

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O0

DdApaDigit
Cudd_ApaShortDivision(int digits,DdApaNumber dividend,DdApaDigit divisor,DdApaNumber quotient)

{
  DdApaDigit DVar1;
  DdApaDoubleDigit partial;
  DdApaDigit remainder;
  int i;
  DdApaNumber quotient_local;
  DdApaDigit divisor_local;
  DdApaNumber dividend_local;
  int digits_local;
  
  partial._0_4_ = 0;
  for (partial._4_4_ = 0; partial._4_4_ < digits; partial._4_4_ = partial._4_4_ + 1) {
    DVar1 = dividend[partial._4_4_];
    quotient[partial._4_4_] = (DdApaDigit)(CONCAT44((DdApaDigit)partial,DVar1) / (ulong)divisor);
    partial._0_4_ = (DdApaDigit)(CONCAT44((DdApaDigit)partial,DVar1) % (ulong)divisor);
  }
  return (DdApaDigit)partial;
}

Assistant:

DdApaDigit
Cudd_ApaShortDivision(
  int  digits,
  DdApaNumber  dividend,
  DdApaDigit  divisor,
  DdApaNumber  quotient)
{
    int i;
    DdApaDigit remainder;
    DdApaDoubleDigit partial;

    remainder = 0;
    for (i = 0; i < digits; i++) {
        partial = remainder * DD_APA_BASE + dividend[i];
        quotient[i] = (DdApaDigit) (partial/(DdApaDoubleDigit)divisor);
        remainder = (DdApaDigit) (partial % divisor);
    }

    return(remainder);

}